

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

size_t __thiscall dynet::Model::updated_parameter_count(Model *this)

{
  uint *puVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar3;
  uint *puVar4;
  
  puVar1 = (this->updated_params).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar3 = 0;
  for (puVar4 = (this->updated_params).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    iVar2 = (*((this->params).
               super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
               ._M_impl.super__Vector_impl_data._M_start[*puVar4]->super_ParameterStorageBase).
              _vptr_ParameterStorageBase[4])();
    sVar3 = sVar3 + CONCAT44(extraout_var,iVar2);
  }
  puVar1 = (this->updated_lookup_params).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar4 = (this->updated_lookup_params).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    iVar2 = (*((this->lookup_params).
               super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
               ._M_impl.super__Vector_impl_data._M_start[*puVar4]->super_ParameterStorageBase).
              _vptr_ParameterStorageBase[4])();
    sVar3 = sVar3 + CONCAT44(extraout_var_00,iVar2);
  }
  return sVar3;
}

Assistant:

size_t Model::updated_parameter_count() const {
  size_t r = 0;
  for (const unsigned idx : updated_params) {
    r += params[idx]->size();
  }
  for (const unsigned idx : updated_lookup_params) {
    r += lookup_params[idx]->size();
  }
  return r;
}